

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O2

bool ensure_file_is_writable(char *pFilename)

{
  FILE *__stream;
  int i;
  uint uVar1;
  
  uVar1 = 0;
  do {
    if (uVar1 == 8) {
LAB_0010c3ef:
      return uVar1 < 8;
    }
    __stream = fopen64(pFilename,"wb");
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
      goto LAB_0010c3ef;
    }
    usleep(250000);
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

static bool ensure_file_is_writable(const char *pFilename)
{
   const int cNumRetries = 8;
   for (int i = 0; i < cNumRetries; i++)
   {
      FILE *pFile = fopen(pFilename, "wb");
      if (pFile)
      {
         fclose(pFile);
         return true;
      }
      Sleep(250);
   }
   return false;
}